

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O2

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  mips_reg Op;
  uint uVar6;
  MCOperand *pMVar7;
  MCRegisterClass *pMVar8;
  int64_t iVar9;
  char *s;
  ulong uVar10;
  char *pcVar11;
  SStream *in_R8;
  uint uStack_30;
  
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 - 0x547 < 2) {
    return;
  }
  if (uVar5 - 0x641 < 2) {
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  switch(uVar5) {
  case 0xa1:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc0f $\x02";
LAB_0018a444:
        s = cs_strdup(pcVar11);
        for (pcVar11 = s; cVar2 = *pcVar11, cVar2 != '\0'; pcVar11 = pcVar11 + 1) {
          if ((cVar2 == ' ') || (cVar2 == '\t')) {
            *pcVar11 = '\0';
            pcVar11 = pcVar11 + 1;
            break;
          }
        }
        SStream_concat0(O,s);
        if (*pcVar11 != '\0') {
          SStream_concat0(O,anon_var_dwarf_709f3 + 0x11);
          do {
            cVar2 = *pcVar11;
            if (cVar2 == '$') {
              pcVar1 = pcVar11 + 1;
              if (*pcVar1 == -1) {
                pcVar11 = pcVar11 + 3;
              }
              else {
                pcVar11 = pcVar11 + 1;
                printOperand(MI,(int)*pcVar1 - 1,O);
              }
            }
            else {
              if (cVar2 == '\0') break;
              SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            }
            pcVar11 = pcVar11 + 1;
          } while( true );
        }
        if (s != (char *)0x0) goto LAB_0018a775;
      }
    }
    break;
  case 0xa2:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc0fl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xa3:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc0t $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xa4:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc0tl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xa5:
  case 0xa8:
  case 0xa9:
  case 0xac:
  case 0xad:
  case 0xb0:
    break;
  case 0xa6:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x9b) {
        pcVar11 = "bc1f $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xa7:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x9b) {
        pcVar11 = "bc1fl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xaa:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x9b) {
        pcVar11 = "bc1t $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xab:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x9b) {
        pcVar11 = "bc1tl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xae:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc2f $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xaf:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc2fl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb1:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc2t $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb2:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc2tl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb3:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc3f $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb4:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc3fl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb5:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc3t $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  case 0xb6:
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 == 2) {
      pMVar7 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar7);
      if (uVar5 == 0x1f) {
        pcVar11 = "bc3tl $\x02";
        goto LAB_0018a444;
      }
    }
    break;
  default:
    if (uVar5 == 0x69e) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar11 = "wait";
            goto LAB_0018a444;
          }
        }
      }
    }
    else if (uVar5 == 0x11a) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 2) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isImm(pMVar7);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,1);
              iVar9 = MCOperand_getImm(pMVar7);
              if (iVar9 == 0) {
                pcVar11 = "break";
                goto LAB_0018a444;
              }
            }
          }
        }
      }
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 2) {
        pMVar7 = MCInst_getOperand(MI,1);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar11 = "break $\x01";
            goto LAB_0018a444;
          }
        }
      }
    }
    else if (uVar5 == 0x20e) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x1c);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x1c);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                uVar5 = MCOperand_getReg(pMVar7);
                if (uVar5 == 0x14b) {
LAB_00189fbc:
                  pcVar11 = "move $\x01, $\x02";
                  goto LAB_0018a444;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x21f) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pcVar11 = "di";
          goto LAB_0018a444;
        }
      }
    }
    else if (uVar5 == 0x278) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pcVar11 = "ei";
          goto LAB_0018a444;
        }
      }
    }
    else if (uVar5 == 0x364) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 2) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            uVar5 = 8;
LAB_00189eb6:
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar5);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pcVar11 = "jr $\x02";
              goto LAB_0018a444;
            }
          }
        }
      }
    }
    else if (uVar5 == 0x366) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 2) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x14b) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            uVar5 = 0x1c;
            goto LAB_00189eb6;
          }
        }
      }
    }
    else if (uVar5 == 0x36a) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 2) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x13) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pcVar11 = "jalr.hb $\x02";
              goto LAB_0018a444;
            }
          }
        }
      }
    }
    else if ((uVar5 == 0x55c) || (uVar5 == 0x55d)) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar11 = "sdbbp";
            goto LAB_0018a444;
          }
        }
      }
    }
    else if (uVar5 == 0x5a2) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        if (uVar5 == 0x15) {
          pMVar7 = MCInst_getOperand(MI,1);
          uVar5 = MCOperand_getReg(pMVar7);
          if (uVar5 == 0x15) {
            pMVar7 = MCInst_getOperand(MI,2);
            _Var4 = MCOperand_isImm(pMVar7);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              iVar9 = MCOperand_getImm(pMVar7);
              if (iVar9 == 0) {
                pcVar11 = "nop";
                goto LAB_0018a444;
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x5fc) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 == 0x15) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isReg(pMVar7);
              if (_Var4) {
                pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar7 = MCInst_getOperand(MI,2);
                uVar5 = MCOperand_getReg(pMVar7);
                _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
                if (_Var4) {
                  pcVar11 = "neg $\x01, $\x03";
                  goto LAB_0018a444;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x623) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            if (uVar5 == 0x15) {
              pMVar7 = MCInst_getOperand(MI,2);
              _Var4 = MCOperand_isReg(pMVar7);
              if (_Var4) {
                pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar7 = MCInst_getOperand(MI,2);
                uVar5 = MCOperand_getReg(pMVar7);
                _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
                if (_Var4) {
                  pcVar11 = "negu $\x01, $\x03";
                  goto LAB_0018a444;
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x638) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar11 = "sync";
            goto LAB_0018a444;
          }
        }
      }
    }
    else if (uVar5 == 0x63a) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar7);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar7);
          if (iVar9 == 0) {
            pcVar11 = "syscall";
            goto LAB_0018a444;
          }
        }
      }
    }
    else if (uVar5 == 0x66c) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "teq $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x670) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "tge $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x675) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "tgeu $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x680) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "tlt $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x684) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "tltu $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (uVar5 == 0x687) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 3) {
        pMVar7 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isReg(pMVar7);
        if (_Var4) {
          pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar7 = MCInst_getOperand(MI,0);
          uVar5 = MCOperand_getReg(pMVar7);
          _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
          if (_Var4) {
            pMVar7 = MCInst_getOperand(MI,1);
            _Var4 = MCOperand_isReg(pMVar7);
            if (_Var4) {
              pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar7 = MCInst_getOperand(MI,1);
              uVar5 = MCOperand_getReg(pMVar7);
              _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
              if (_Var4) {
                pMVar7 = MCInst_getOperand(MI,2);
                _Var4 = MCOperand_isImm(pMVar7);
                if (_Var4) {
                  pMVar7 = MCInst_getOperand(MI,2);
                  iVar9 = MCOperand_getImm(pMVar7);
                  if (iVar9 == 0) {
                    pcVar11 = "tne $\x01, $\x02";
                    goto LAB_0018a444;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((uVar5 == 0x45) && (uVar5 = MCInst_getNumOperands(MI), uVar5 == 3)) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      if (_Var4) {
        pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
        if (_Var4) {
          pMVar7 = MCInst_getOperand(MI,1);
          _Var4 = MCOperand_isReg(pMVar7);
          if (_Var4) {
            pMVar8 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar7 = MCInst_getOperand(MI,1);
            uVar5 = MCOperand_getReg(pMVar7);
            _Var4 = MCRegisterClass_contains(pMVar8,uVar5);
            if (_Var4) {
              pMVar7 = MCInst_getOperand(MI,2);
              uVar5 = MCOperand_getReg(pMVar7);
              if (uVar5 == 0x15) goto LAB_00189fbc;
            }
          }
        }
      }
    }
  }
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 == 0xa6) {
    _Var4 = isReg(MI,0,0x9b);
    if (!_Var4) goto LAB_0018a79c;
    pcVar11 = "bc1f";
LAB_0018a719:
    uVar5 = 1;
LAB_0018a71b:
    s = printAlias1(pcVar11,MI,uVar5,O);
LAB_0018a76d:
    if (s != (char *)0x0) {
LAB_0018a775:
      Op = Mips_map_insn(s);
      MCInst_setOpcodePub(MI,Op);
      (*cs_mem_free)(s);
      return;
    }
  }
  else {
    if (uVar5 == 0xaa) {
      _Var4 = isReg(MI,0,0x9b);
      if (_Var4) {
        pcVar11 = "bc1t";
        goto LAB_0018a719;
      }
      goto LAB_0018a79c;
    }
    if (uVar5 == 0x4dd) {
      _Var4 = isReg(MI,2,0x15);
      if (!_Var4) goto LAB_0018a79c;
      pcVar11 = "move";
LAB_0018a6d8:
      uVar5 = 1;
LAB_0018a761:
      s = printAlias2(pcVar11,MI,uVar5,(uint)O,in_R8);
      goto LAB_0018a76d;
    }
    if (uVar5 == 0xc0) {
      uVar5 = 0x14b;
LAB_0018a74f:
      _Var4 = isReg(MI,1,uVar5);
      if (!_Var4) goto LAB_0018a79c;
      pcVar11 = "beqz";
LAB_0018a75f:
      uVar5 = 2;
      goto LAB_0018a761;
    }
    if (uVar5 == 0xc2) {
      _Var4 = isReg(MI,0,0x15);
      if ((_Var4) && (_Var4 = isReg(MI,1,0x15), _Var4)) {
        pcVar11 = "beqzl";
        goto LAB_0018a75f;
      }
    }
    else if (uVar5 == 0xcb) {
      _Var4 = isReg(MI,0,0x15);
      if (_Var4) {
        pcVar11 = "bal";
        goto LAB_0018a719;
      }
    }
    else {
      if (uVar5 == 0x101) {
        uVar5 = 0x15;
      }
      else {
        if (uVar5 != 0x102) {
          if (uVar5 == 0x10c) {
            _Var4 = isReg(MI,1,0x15);
            if (_Var4) {
              pcVar11 = "bnezl";
              goto LAB_0018a75f;
            }
            goto LAB_0018a79c;
          }
          if (uVar5 != 0x364) {
            if (uVar5 == 0x366) {
              uVar5 = 0x115;
              goto LAB_0018a6e7;
            }
            if (uVar5 == 0x4d3) {
LAB_0018a5c3:
              uVar5 = 0x15;
LAB_0018a677:
              _Var4 = isReg(MI,2,uVar5);
              if (_Var4) {
                pcVar11 = "not";
                goto LAB_0018a6d8;
              }
              goto LAB_0018a79c;
            }
            if (uVar5 == 0x4d4) {
              uVar5 = 0x14b;
              goto LAB_0018a677;
            }
            if (uVar5 == 0x4d6) goto LAB_0018a5c3;
            if (uVar5 != 0xbf) goto LAB_0018a79c;
            _Var4 = isReg(MI,0,0x15);
            if ((!_Var4) || (_Var4 = isReg(MI,1,0x15), !_Var4)) {
              uVar5 = 0x15;
              goto LAB_0018a74f;
            }
            pcVar11 = "b";
            uVar5 = 2;
            goto LAB_0018a71b;
          }
          uVar5 = 0x13;
LAB_0018a6e7:
          _Var4 = isReg(MI,0,uVar5);
          if (_Var4) {
            pcVar11 = "jalr";
            goto LAB_0018a719;
          }
          goto LAB_0018a79c;
        }
        uVar5 = 0x14b;
      }
      _Var4 = isReg(MI,1,uVar5);
      if (_Var4) {
        pcVar11 = "bnez";
        goto LAB_0018a75f;
      }
    }
  }
LAB_0018a79c:
  uVar5 = MCInst_getOpcode(MI);
  uVar5 = *(uint *)(printInstruction_OpInfo + (ulong)uVar5 * 4);
  uVar6 = MCInst_getOpcode(MI);
  bVar3 = printInstruction_OpInfo2[uVar6];
  SStream_concat0(O,s_DSPCarry_0030abb7 + (ulong)(uVar5 & 0x3fff) + 8);
  switch(uVar5 >> 0xe & 7) {
  default:
    goto switchD_0018a7fc_caseD_0;
  case 1:
    break;
  case 2:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,", ");
    uStack_30 = 0;
    goto LAB_0018ab02;
  case 3:
    printOperand(MI,1,O);
    SStream_concat0(O,", ");
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018a8a6_caseD_0;
    case 1:
      goto switchD_0018a8a6_caseD_1;
    case 2:
      goto switchD_0018a8a6_caseD_2;
    case 3:
      goto switchD_0018a7fc_caseD_0;
    case 4:
      goto switchD_0018a8a6_caseD_4;
    case 5:
      goto switchD_0018a8a6_caseD_5;
    case 6:
      goto switchD_0018a8a6_caseD_6;
    case 7:
      goto switchD_0018a8a6_caseD_7;
    case 8:
      goto switchD_0018a8a6_caseD_8;
    case 9:
      goto switchD_0018a8a6_caseD_9;
    case 10:
      goto switchD_0018a8a6_caseD_a;
    case 0xb:
      goto switchD_0018a8a6_caseD_b;
    case 0xc:
      goto switchD_0018a8a6_caseD_c;
    case 0xd:
      goto switchD_0018a8a6_caseD_d;
    case 0xe:
      goto switchD_0018a8a6_caseD_e;
    }
  case 4:
    pMVar7 = MCInst_getOperand(MI,2);
    uVar10 = MCOperand_getImm(pMVar7);
    if ((uVar10 & 0xffffffe0) == 0) {
      pcVar11 = &DAT_001e2870 + *(int *)(&DAT_001e2870 + (ulong)((uint)uVar10 & 0x1f) * 4);
    }
    else {
      pcVar11 = (char *)0x0;
    }
    SStream_concat0(O,pcVar11);
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018a8a6_caseD_0;
    case 1:
      goto switchD_0018a8a6_caseD_1;
    case 2:
      goto switchD_0018a8a6_caseD_2;
    case 3:
      goto switchD_0018a7fc_caseD_0;
    case 4:
      goto switchD_0018a8a6_caseD_4;
    case 5:
      goto switchD_0018a8a6_caseD_5;
    case 6:
      goto switchD_0018a8a6_caseD_6;
    case 7:
      goto switchD_0018a8a6_caseD_7;
    case 8:
      goto switchD_0018a8a6_caseD_8;
    case 9:
      goto switchD_0018a8a6_caseD_9;
    case 10:
      goto switchD_0018a8a6_caseD_a;
    case 0xb:
      goto switchD_0018a8a6_caseD_b;
    case 0xc:
      goto switchD_0018a8a6_caseD_c;
    case 0xd:
      goto switchD_0018a8a6_caseD_d;
    case 0xe:
      goto switchD_0018a8a6_caseD_e;
    }
  case 5:
    printOperand(MI,2,O);
    pcVar11 = ", ";
    goto LAB_0018a8db;
  case 6:
    printOperand(MI,3,O);
    switch(uVar5 >> 0x11 & 0xf) {
    default:
      goto switchD_0018a8a6_caseD_0;
    case 1:
      goto switchD_0018a8a6_caseD_1;
    case 2:
      goto switchD_0018a8a6_caseD_2;
    case 3:
      goto switchD_0018a7fc_caseD_0;
    case 4:
      goto switchD_0018a8a6_caseD_4;
    case 5:
      goto switchD_0018a8a6_caseD_5;
    case 6:
      goto switchD_0018a8a6_caseD_6;
    case 7:
      goto switchD_0018a8a6_caseD_7;
    case 8:
      goto switchD_0018a8a6_caseD_8;
    case 9:
      goto switchD_0018a8a6_caseD_9;
    case 10:
      goto switchD_0018a8a6_caseD_a;
    case 0xb:
      goto switchD_0018a8a6_caseD_b;
    case 0xc:
      goto switchD_0018a8a6_caseD_c;
    case 0xd:
      goto switchD_0018a8a6_caseD_d;
    case 0xe:
      goto switchD_0018a8a6_caseD_e;
    }
  }
  printOperand(MI,0,O);
  switch(uVar5 >> 0x11 & 0xf) {
  default:
switchD_0018a8a6_caseD_0:
    pcVar11 = ", ";
    break;
  case 1:
switchD_0018a8a6_caseD_1:
    pcVar11 = ", $pc, ";
    goto LAB_0018aa3b;
  case 2:
switchD_0018a8a6_caseD_2:
    pcVar11 = " # 16 bit inst";
    goto LAB_0018ab68;
  case 3:
    goto switchD_0018a7fc_caseD_0;
  case 4:
    goto switchD_0018a8a6_caseD_4;
  case 5:
    goto switchD_0018a8a6_caseD_5;
  case 6:
switchD_0018a8a6_caseD_6:
    printOperand(MI,2,O);
    goto LAB_0018a9ca;
  case 7:
switchD_0018a8a6_caseD_7:
    pcVar11 = ".d\t";
    goto LAB_0018aa1f;
  case 8:
switchD_0018a8a6_caseD_8:
    pcVar11 = ".s\t";
LAB_0018aa1f:
    SStream_concat0(O,pcVar11);
    printOperand(MI,0,O);
    pcVar11 = ", ";
LAB_0018aa3b:
    SStream_concat0(O,pcVar11);
    uStack_30 = 1;
    goto LAB_0018aa49;
  case 9:
switchD_0018a8a6_caseD_9:
    pcVar11 = "[";
    break;
  case 10:
switchD_0018a8a6_caseD_a:
    pcVar11 = "\n\tnop";
    goto LAB_0018ab68;
  case 0xb:
switchD_0018a8a6_caseD_b:
    pcVar11 = "\t# branch\n\tnop";
    goto LAB_0018ab68;
  case 0xc:
switchD_0018a8a6_caseD_c:
    SStream_concat0(O,", 1f\n\tb\t2f\n\t.align\t2\n1: \t.word\t");
    printOperand(MI,1,O);
    pcVar11 = "\n2:";
    goto LAB_0018ab68;
  case 0xd:
switchD_0018a8a6_caseD_d:
    uStack_30 = 2;
    goto LAB_0018ab02;
  case 0xe:
switchD_0018a8a6_caseD_e:
    pcVar11 = ", .+4\n\t\n\tmove ";
    goto LAB_0018a95d;
  }
  SStream_concat0(O,pcVar11);
LAB_0018a9ca:
  switch(uVar5 >> 0x15 & 0xf) {
  case 1:
    uVar6 = 2;
    break;
  case 2:
    goto switchD_0018a9ee_caseD_2;
  case 3:
    goto switchD_0018a7fc_caseD_0;
  case 4:
    printUnsignedImm(MI,3,O);
    pcVar11 = "], ";
    goto LAB_0018aa0c;
  case 5:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,"], ");
    printOperand(MI,3,O);
    SStream_concat0(O,"[");
    printUnsignedImm(MI,4,O);
    goto switchD_0018ad4a_caseD_2;
  case 6:
    uStack_30 = 1;
LAB_0018ab02:
    printMemOperand(MI,uStack_30,O);
    return;
  case 7:
    uStack_30 = 1;
    goto LAB_0018ab16;
  case 8:
    pcVar11 = "\n\tmflo\t";
LAB_0018a8db:
    SStream_concat0(O,pcVar11);
switchD_0018a8a6_caseD_5:
    uStack_30 = 0;
    goto LAB_0018aa49;
  case 9:
    uVar6 = 4;
    break;
  case 10:
    SStream_concat0(O,"\n\tmove\t");
    printOperand(MI,0,O);
    pcVar11 = ", $t8";
    goto LAB_0018ab68;
  default:
    uVar6 = 1;
  }
  printOperand(MI,uVar6,O);
  switch(uVar5 >> 0x19 & 0xf) {
  default:
    goto switchD_0018a7fc_caseD_0;
  case 1:
    pcVar11 = ", ";
    goto LAB_0018abf9;
  case 2:
    pcVar11 = "\t# 16 bit inst";
    break;
  case 3:
    goto switchD_0018a8a6_caseD_4;
  case 4:
    pcVar11 = "\n\tbteqz\t";
    goto LAB_0018aa0c;
  case 5:
    pcVar11 = "\n\tbtnez\t";
    goto LAB_0018aa0c;
  case 6:
    pcVar11 = "[";
LAB_0018abf9:
    SStream_concat0(O,pcVar11);
    switch(uVar5 >> 0x1d) {
    case 1:
      goto switchD_0018ac20_caseD_1;
    case 2:
      printUnsignedImm(MI,2,O);
      switch(bVar3 & 3) {
      default:
        goto switchD_0018a7fc_caseD_0;
      case 1:
        goto switchD_0018ad4a_caseD_1;
      case 2:
        goto switchD_0018ad4a_caseD_2;
      }
    case 3:
      printUnsignedImm8(MI,3,O);
      switch(bVar3 & 3) {
      default:
        goto switchD_0018a7fc_caseD_0;
      case 1:
        goto switchD_0018ad4a_caseD_1;
      case 2:
        goto switchD_0018ad4a_caseD_2;
      }
    case 4:
      printOperand(MI,3,O);
      switch(bVar3 & 3) {
      default:
        goto switchD_0018a7fc_caseD_0;
      case 1:
        goto switchD_0018ad4a_caseD_1;
      case 2:
        goto switchD_0018ad4a_caseD_2;
      }
    default:
      printOperand(MI,2,O);
      switch(bVar3 & 3) {
      default:
        goto switchD_0018a7fc_caseD_0;
      case 1:
        goto switchD_0018ad4a_caseD_1;
      case 2:
        goto switchD_0018ad4a_caseD_2;
      }
    }
  case 7:
    pcVar11 = " \t# 16 bit inst";
    break;
  case 8:
    pcVar11 = ", 32";
    break;
  case 9:
    SStream_concat0(O,"\n\taddiu\t");
    printOperand(MI,1,O);
    SStream_concat0(O,", $pc, ");
    printOperand(MI,3,O);
    pcVar11 = "\n ";
    break;
  case 10:
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    pcVar11 = ")";
    break;
  case 0xb:
    SStream_concat0(O," ( ");
    printOperand(MI,1,O);
    pcVar11 = " ); ";
    break;
  case 0xc:
    pcVar11 = ", 0";
    break;
  case 0xd:
    pcVar11 = "\n\tbteqz\t.+4\n\tmove ";
    goto LAB_0018a95d;
  case 0xe:
    pcVar11 = "\n\tbtnez\t.+4\n\tmove ";
LAB_0018a95d:
    SStream_concat0(O,pcVar11);
switchD_0018a9ee_caseD_2:
    printOperand(MI,1,O);
    pcVar11 = ", ";
LAB_0018aa0c:
    SStream_concat0(O,pcVar11);
    uStack_30 = 2;
LAB_0018aa49:
    printOperand(MI,uStack_30,O);
    return;
  }
  goto LAB_0018ab68;
switchD_0018ac20_caseD_1:
  printUnsignedImm8(MI,2,O);
  switch(bVar3 & 3) {
  default:
switchD_0018a7fc_caseD_0:
    return;
  case 1:
switchD_0018ad4a_caseD_1:
    SStream_concat0(O,", ");
    uStack_30 = 3;
    if ((bVar3 & 4) == 0) {
LAB_0018ab16:
      printUnsignedImm(MI,uStack_30,O);
      return;
    }
    break;
  case 2:
switchD_0018ad4a_caseD_2:
    pcVar11 = "]";
    goto LAB_0018ab68;
  }
  goto LAB_0018aa49;
switchD_0018a8a6_caseD_4:
  pcVar11 = "  # 16 bit inst";
LAB_0018ab68:
  SStream_concat0(O,pcVar11);
  return;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}